

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxflow.c
# Opt level: O2

void flow_network_create(FlowNetwork *network,int32_t nnodes)

{
  flow_t *pfVar1;
  
  if (network->nnodes != 0) {
    flow_network_destroy(network);
  }
  network->nnodes = nnodes;
  pfVar1 = (flow_t *)calloc((ulong)(uint)(nnodes * nnodes),4);
  network->caps = pfVar1;
  if (pfVar1 != (flow_t *)0x0) {
    return;
  }
  flow_network_destroy(network);
  return;
}

Assistant:

void flow_network_create(FlowNetwork *network, int32_t nnodes) {
    if (network->nnodes) {
        flow_network_destroy(network);
    }
    network->nnodes = nnodes;
    int32_t nsquared = nnodes * nnodes;
    network->caps = calloc(nsquared, sizeof(*network->caps));

    if (!network->caps) {
        flow_network_destroy(network);
    }
}